

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int exprIsDeterministic(Expr *p)

{
  undefined1 local_40 [8];
  Walker w;
  Expr *p_local;
  
  w.u = (anon_union_8_14_c5524298_for_u)p;
  memset(local_40,0,0x30);
  w.xSelectCallback2._4_1_ = 1;
  w.pParse = (Parse *)exprNodeIsDeterministic;
  w.xExprCallback = sqlite3SelectWalkFail;
  sqlite3WalkExpr((Walker *)local_40,(Expr *)w.u.pNC);
  return (int)w.xSelectCallback2._4_1_;
}

Assistant:

static int exprIsDeterministic(Expr *p){
  Walker w;
  memset(&w, 0, sizeof(w));
  w.eCode = 1;
  w.xExprCallback = exprNodeIsDeterministic;
  w.xSelectCallback = sqlite3SelectWalkFail;
  sqlite3WalkExpr(&w, p);
  return w.eCode;
}